

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

bool __thiscall QListView::isIndexHidden(QListView *this,QModelIndex *index)

{
  QListViewPrivate *this_00;
  bool bVar1;
  char cVar2;
  long in_FS_OFFSET;
  QModelIndex QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar1 = QListViewPrivate::isHidden(this_00,index->r);
  if (bVar1) {
    QModelIndex::parent(&QStack_38,index);
    cVar2 = ::comparesEqual(&(this_00->super_QAbstractItemViewPrivate).root,&QStack_38);
    if (cVar2 != '\0') {
      bVar1 = index->c == this_00->column;
      goto LAB_00515c44;
    }
  }
  bVar1 = false;
LAB_00515c44:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QListView::isIndexHidden(const QModelIndex &index) const
{
    Q_D(const QListView);
    return (d->isHidden(index.row())
            && (index.parent() == d->root)
            && index.column() == d->column);
}